

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O2

void latency_tcp_main(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  host_tuple *phVar7;
  int64_t iVar8;
  tcp_connection *conn;
  request *prVar9;
  ulong uVar10;
  ssize_t sVar11;
  application_protocol *paVar12;
  int64_t iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  long lVar19;
  long in_FS_OFFSET;
  byte_req_pair bVar20;
  int one;
  int million;
  linger linger;
  sockaddr_in addr;
  char hostname [64];
  
  million = 1000000;
  one = 1;
  addr.sin_family = 2;
  iVar2 = get_conn_count();
  iVar3 = get_thread_count();
  iVar4 = (int)((long)iVar2 / (long)iVar3);
  pvVar6 = calloc((long)iVar4,0x400c);
  *(void **)(in_FS_OFFSET + -0x1f0) = pvVar6;
  phVar7 = get_targets();
  uVar16 = 0;
  uVar10 = (long)iVar2 / (long)iVar3 & 0xffffffff;
  if (iVar4 < 1) {
    uVar10 = uVar16;
  }
  lVar18 = 6;
  do {
    if (uVar10 == uVar16) {
      lVar18 = time_ns();
      do {
        do {
          do {
            lVar19 = lVar18;
            iVar2 = should_load();
            iVar8 = time_ns();
            lVar18 = iVar8;
          } while (iVar2 == 0);
          lVar18 = lVar19;
        } while ((iVar8 < lVar19) || (conn = pick_conn(), conn == (tcp_connection *)0x0));
        prVar9 = prepare_request();
        uVar16 = 0;
        uVar10 = (ulong)(uint)prVar9->iov_cnt;
        if (prVar9->iov_cnt < 1) {
          uVar10 = uVar16;
        }
        uVar15 = 0;
        for (; uVar10 * 0x10 != uVar16; uVar16 = uVar16 + 0x10) {
          uVar15 = uVar15 + *(int *)((long)&prVar9->iovs[0].iov_len + uVar16);
        }
        iVar8 = time_ns();
        sVar11 = writev(conn->fd,(iovec *)prVar9->iovs,prVar9->iov_cnt);
        uVar5 = (uint)sVar11;
        if ((int)uVar5 < 0) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar17 = "Writev failed\n";
LAB_0010843e:
          perror(pcVar17);
          return;
        }
        if (uVar15 != uVar5) {
          __assert_fail("ret == bytes_to_send",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                        ,0x178,"void latency_tcp_main(void)");
        }
        bVar20.reqs = 1;
        bVar20.bytes = (ulong)(uVar5 & 0x7fffffff);
        add_throughput_tx_sample(bVar20);
        if (conn->buffer_idx != 0) {
          __assert_fail("conn->buffer_idx == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                        ,0x17e,"void latency_tcp_main(void)");
        }
        uVar1 = 0;
        do {
          if (0x3fff < uVar1) {
            __assert_fail("MAX_PAYLOAD - conn->buffer_idx > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                          ,0x180,"void latency_tcp_main(void)");
          }
          sVar11 = recv(conn->fd,conn->buffer + uVar1,(ulong)(ushort)(0x4000 - uVar1),0);
          if ((int)sVar11 < 0) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            pcVar17 = "Error read\n";
            goto LAB_0010843e;
          }
          if ((int)sVar11 == 0) {
            close(conn->fd);
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            fwrite("Connection closed\n",0x12,1,_stderr);
            conn->closed = 1;
          }
          else {
            conn->buffer_idx = conn->buffer_idx + (short)sVar11;
            bVar20 = handle_response(conn);
            if (bVar20.reqs != 0) {
              paVar12 = get_app_proto();
              if ((bVar20.reqs != 1) && (paVar12->type == PROTO_MEMCACHED_BIN)) {
                __assert_fail("read_res.reqs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                              ,0x191,"void latency_tcp_main(void)");
              }
              iVar13 = time_ns();
              add_throughput_rx_sample(bVar20);
              add_latency_sample(iVar13 - iVar8,(timespec *)0x0);
              lVar18 = get_ia();
              lVar19 = lVar19 + lVar18;
            }
          }
          uVar1 = conn->buffer_idx;
          lVar18 = lVar19;
        } while (uVar1 != 0);
      } while( true );
    }
    iVar2 = socket(2,1,0);
    if (iVar2 == -1) {
      gethostname(hostname,0x40);
      fprintf(_stderr,"[%s] ",hostname);
      pcVar17 = "Error creating socket";
LAB_001083ff:
      perror(pcVar17);
      iVar2 = -1;
LAB_00108406:
      exit(iVar2);
    }
    iVar3 = get_target_count();
    uVar14 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) % (long)iVar3
             & 0xffffffff;
    addr.sin_port = phVar7[uVar14].port << 8 | phVar7[uVar14].port >> 8;
    addr.sin_addr.s_addr = phVar7[uVar14].ip;
    iVar3 = connect(iVar2,(sockaddr *)&addr,0x10);
    if (iVar3 != 0) {
      gethostname(hostname,0x40);
      fprintf(_stderr,"[%s] ",hostname);
      pcVar17 = "Error connecting";
      goto LAB_001083ff;
    }
    iVar3 = setsockopt(iVar2,6,1,&one,4);
    if (iVar3 != 0) {
      gethostname(hostname,0x40);
      fprintf(_stderr,"[%s] ",hostname);
      pcVar17 = "Error setsockopt TCP_NODELAY";
      goto LAB_001083ff;
    }
    linger.l_onoff = 1;
    linger.l_linger = 0;
    iVar3 = setsockopt(iVar2,1,0xd,&linger,8);
    if (iVar3 != 0) {
      perror("setsockopt(SO_LINGER)");
      iVar2 = 1;
      goto LAB_00108406;
    }
    iVar3 = setsockopt(iVar2,1,0x2e,&million,4);
    if (iVar3 != 0) {
      gethostname(hostname,0x40);
      fprintf(_stderr,"[%s] ",hostname);
      pcVar17 = "Error setsockopt SO_BUSY_POLL";
      goto LAB_001083ff;
    }
    lVar19 = *(long *)(in_FS_OFFSET + -0x1f0);
    *(int *)(lVar19 + -6 + lVar18) = iVar2;
    *(undefined2 *)(lVar19 + lVar18) = 0;
    uVar16 = uVar16 + 1;
    lVar18 = lVar18 + 0x400c;
  } while( true );
}

Assistant:

static void latency_tcp_main(void)
{
	int i, ret, bytes_to_send;
	long start_time, end_time, next_tx;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;

	if (latency_open_connections())
		exit(-1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() < next_tx)
			continue;
		conn = pick_conn();
		if (!conn)
			continue;

		to_send = prepare_request();
		bytes_to_send = 0;
		for (i = 0; i < to_send->iov_cnt; i++)
			bytes_to_send += to_send->iovs[i].iov_len;

		start_time = time_ns();
		ret = writev(conn->fd, to_send->iovs, to_send->iov_cnt);
		if (ret < 0) {
			lancet_perror("Writev failed\n");
			return;
		}
		assert(ret == bytes_to_send);
		/* Bookkeeping */
		send_res.bytes = ret;
		send_res.reqs = 1;
		add_throughput_tx_sample(send_res);

		assert(conn->buffer_idx == 0);
		do {
			assert(MAX_PAYLOAD - conn->buffer_idx > 0);
			ret = recv(conn->fd, &conn->buffer[conn->buffer_idx], MAX_PAYLOAD - conn->buffer_idx, 0);
			if (ret < 0) {
				lancet_perror("Error read\n");
				return;
			}
			if (ret == 0) {
				close(conn->fd);
				lancet_fprintf(stderr, "Connection closed\n");
				conn->closed = 1;
				continue;
			}

			conn->buffer_idx += ret;
			read_res = handle_response(conn);
			if (read_res.reqs > 0) {
                                if (get_app_proto()->type == PROTO_MEMCACHED_BIN) {
                                        assert(read_res.reqs == 1);
                                }
				end_time = time_ns();
				/*BookKeeping*/
				add_throughput_rx_sample(read_res);
				add_latency_sample((end_time - start_time), NULL);

				/*Schedule next*/
				next_tx += get_ia();
			}
		} while (conn->buffer_idx);
	}
}